

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_impl.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::regex_impl(regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *that)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  traits<char> *ptVar2;
  finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pfVar3;
  size_t sVar4;
  
  enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::enable_reference_tracking
            (&this->
              super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ,&that->
               super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            );
  pmVar1 = (that->xpr_).px;
  (this->xpr_).px = pmVar1;
  if (pmVar1 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    LOCK();
    (pmVar1->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         (pmVar1->
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
  }
  ptVar2 = (that->traits_).px;
  (this->traits_).px = ptVar2;
  if (ptVar2 != (traits<char> *)0x0) {
    LOCK();
    (ptVar2->super_counted_base<boost::xpressive::detail::traits<char>_>).count_.value_ =
         (ptVar2->super_counted_base<boost::xpressive::detail::traits<char>_>).count_.value_ + 1;
    UNLOCK();
  }
  pfVar3 = (that->finder_).px;
  (this->finder_).px = pfVar3;
  if (pfVar3 != (finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    LOCK();
    (pfVar3->
    super_counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         (pfVar3->
         super_counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
  }
  std::
  vector<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ::vector(&this->named_marks_,&that->named_marks_);
  sVar4 = that->hidden_mark_count_;
  this->mark_count_ = that->mark_count_;
  this->hidden_mark_count_ = sVar4;
  return;
}

Assistant:

regex_impl(regex_impl<BidiIter> const &that)
      : enable_reference_tracking<regex_impl<BidiIter> >(that)
      , xpr_(that.xpr_)
      , traits_(that.traits_)
      , finder_(that.finder_)
      , named_marks_(that.named_marks_)
      , mark_count_(that.mark_count_)
      , hidden_mark_count_(that.hidden_mark_count_)
    {
        #ifdef BOOST_XPRESSIVE_DEBUG_CYCLE_TEST
        ++instances;
        #endif
    }